

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

Reference<std::allocator<absl::lts_20250127::LogSink_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>::
EmplaceBackSlow<absl::lts_20250127::LogSink*const&>
          (Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
           *this,LogSink **args)

{
  LogSink **ppLVar1;
  ulong uVar2;
  ulong uVar3;
  Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>> *pSVar4;
  size_type __n;
  LogSink **local_38;
  size_type sStack_30;
  
  uVar3 = *(ulong *)this;
  pSVar4 = *(Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
             **)(this + 8);
  local_38 = (LogSink **)0x0;
  sStack_30 = 0;
  __n = 0x20;
  if ((uVar3 & 1) != 0) {
    __n = *(long *)(this + 0x10) * 2;
  }
  local_38 = __gnu_cxx::new_allocator<absl::lts_20250127::LogSink_*>::allocate
                       ((new_allocator<absl::lts_20250127::LogSink_*> *)&local_38,__n,(void *)0x0);
  uVar2 = uVar3 >> 1;
  local_38[uVar2] = *args;
  if (1 < uVar3) {
    if ((uVar3 & 1) == 0) {
      pSVar4 = this + 8;
    }
    uVar3 = 0;
    do {
      local_38[uVar3] = *(LogSink **)(pSVar4 + uVar3 * 8);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  ppLVar1 = local_38 + uVar2;
  uVar3 = *(ulong *)this;
  sStack_30 = __n;
  if ((uVar3 & 1) != 0) {
    operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    uVar3 = *(ulong *)this;
  }
  *(LogSink ***)(this + 8) = local_38;
  *(size_type *)(this + 0x10) = sStack_30;
  *(ulong *)this = (uVar3 | 1) + 2;
  return ppLVar1;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }